

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::AddInterfaceDepends
          (cmComputeTargetDepends *this,int depender_index,cmLinkItem *dependee_name,string *config,
          set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted)

{
  cmGeneratorTarget *t;
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  reference ppcVar3;
  cmListFileBacktrace local_88;
  cmLinkItem local_78;
  cmGeneratorTarget *local_40;
  cmGeneratorTarget *dependee;
  cmGeneratorTarget *depender;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted_local;
  string *config_local;
  cmLinkItem *dependee_name_local;
  cmComputeTargetDepends *pcStack_10;
  int depender_index_local;
  cmComputeTargetDepends *this_local;
  
  depender = (cmGeneratorTarget *)emitted;
  emitted_local = (set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)config;
  config_local = &dependee_name->String;
  dependee_name_local._4_4_ = depender_index;
  pcStack_10 = this;
  ppcVar3 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            operator[](&this->Targets,(long)depender_index);
  dependee = *ppcVar3;
  local_40 = *(cmGeneratorTarget **)(config_local + 1);
  if (local_40 != (cmGeneratorTarget *)0x0) {
    TVar2 = cmGeneratorTarget::GetType(local_40);
    if (TVar2 == EXECUTABLE) {
      bVar1 = cmGeneratorTarget::IsExecutableWithExports(local_40);
      if (!bVar1) {
        local_40 = (cmGeneratorTarget *)0x0;
      }
    }
  }
  this_00 = depender;
  t = dependee;
  if (local_40 != (cmGeneratorTarget *)0x0) {
    local_88.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_88.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_88);
    cmLinkItem::cmLinkItem(&local_78,t,&local_88);
    std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
              ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)this_00,
               &local_78);
    cmLinkItem::~cmLinkItem(&local_78);
    cmListFileBacktrace::~cmListFileBacktrace(&local_88);
    AddInterfaceDepends(this,dependee_name_local._4_4_,local_40,
                        (cmListFileBacktrace *)&config_local[1]._M_string_length,
                        (string *)emitted_local,
                        (set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                        depender);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddInterfaceDepends(
  int depender_index, cmLinkItem const& dependee_name,
  const std::string& config, std::set<cmLinkItem>& emitted)
{
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  cmGeneratorTarget const* dependee = dependee_name.Target;
  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if (dependee && dependee->GetType() == cmStateEnums::EXECUTABLE &&
      !dependee->IsExecutableWithExports()) {
    dependee = nullptr;
  }

  if (dependee) {
    // A target should not depend on itself.
    emitted.insert(cmLinkItem(depender, cmListFileBacktrace()));
    this->AddInterfaceDepends(depender_index, dependee,
                              dependee_name.Backtrace, config, emitted);
  }
}